

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token __thiscall slang::parsing::Lexer::lexDirective(Lexer *this)

{
  bool enableLegacyProtect;
  SyntaxKind SVar1;
  uint uVar2;
  Token TVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  string_view directive_00;
  SyntaxKind directive;
  undefined4 uStack_1c;
  char *local_18;
  
  if (*this->sourceBuffer == '\\') {
    this->sourceBuffer = this->sourceBuffer + 1;
    TVar3 = lexEscapeSequence(this,true);
    return TVar3;
  }
  scanIdentifier(this);
  local_18 = this->marker;
  uVar2 = *(int *)&this->sourceBuffer - (int)local_18;
  _directive = (ulong)uVar2;
  if (uVar2 == 1) {
    TVar3 = create<>(this,Unknown);
    return TVar3;
  }
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&directive,1,
                     0xffffffffffffffff);
  enableLegacyProtect = (this->options).enableLegacyProtect;
  directive_00._M_str._0_1_ = enableLegacyProtect;
  directive_00._M_len = (size_t)bVar4._M_str;
  directive_00._M_str._1_7_ = 0;
  SVar1 = LexerFacts::getDirectiveKind((LexerFacts *)bVar4._M_len,directive_00,enableLegacyProtect);
  _directive = CONCAT44(uStack_1c,SVar1);
  TVar3 = create<slang::syntax::SyntaxKind&>(this,Directive,&directive);
  return TVar3;
}

Assistant:

Token Lexer::lexDirective() {
    if (peek() == '\\') {
        // Handle escaped macro names as well.
        advance();
        return lexEscapeSequence(true);
    }

    scanIdentifier();

    // if length is 1, we just have a grave character on its own, which is an error
    if (lexemeLength() == 1) {
        // Error issued in the Preprocessor
        return create(TokenKind::Unknown);
    }

    SyntaxKind directive = LF::getDirectiveKind(lexeme().substr(1), options.enableLegacyProtect);
    return create(TokenKind::Directive, directive);
}